

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

difference_type __thiscall
protozero::const_varint_iterator<int>::distance
          (const_varint_iterator<int> *this,const_varint_iterator<int> begin,
          const_varint_iterator<int> end)

{
  const_varint_iterator<int> end_local;
  const_varint_iterator<int> begin_local;
  
  if (this == (const_varint_iterator<int> *)0x0) {
    begin_local.m_end = (char *)0x0;
  }
  else {
    begin_local.m_end =
         (char *)std::
                 count_if<char_const*,protozero::const_varint_iterator<int>::distance(protozero::const_varint_iterator<int>,protozero::const_varint_iterator<int>)::_lambda(char)_1_>
                           (this,begin.m_end,begin.m_end,end.m_data,end.m_end);
  }
  return (difference_type)begin_local.m_end;
}

Assistant:

static difference_type distance(const_varint_iterator begin, const_varint_iterator end) noexcept {
        // The "distance" between default initialized const_varint_iterator's
        // is always 0.
        if (!begin.m_data) {
            return 0;
        }
        // We know that each varint contains exactly one byte with the most
        // significant bit not set. We can use this to quickly figure out
        // how many varints there are without actually decoding the varints.
        return std::count_if(begin.m_data, end.m_data, [](char c) noexcept {
            return (static_cast<unsigned char>(c) & 0x80U) == 0;
        });
    }